

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

cmpResult __thiscall llvm::APFloat::compare(APFloat *this,APFloat *RHS)

{
  byte bVar1;
  byte bVar2;
  cmpResult cVar3;
  bool bVar4;
  uint uVar5;
  Storage *rhs;
  Storage *this_00;
  
  if ((this->U).semantics != (RHS->U).semantics) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only compare APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x450,"cmpResult llvm::APFloat::compare(const APFloat &) const");
  }
  this_00 = &this->U;
  rhs = &RHS->U;
  if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    if ((this_00->IEEE).semantics == (rhs->IEEE).semantics) {
      bVar1 = *(byte *)((long)&this->U + 0x12);
      bVar2 = *(byte *)((long)&RHS->U + 0x12);
      cVar3 = cmpUnordered;
      switch((bVar2 & 7) + (bVar1 & 7) * '\x04') {
      case 0:
        uVar5 = bVar1 >> 3 & 1;
        cVar3 = cmpEqual;
        if (SUB41(uVar5,0) != ((bVar2 >> 3 & 1) != 0)) {
          cVar3 = uVar5 * 2 ^ cmpGreaterThan;
        }
        break;
      case 1:
      case 4:
      case 5:
      case 6:
      case 7:
      case 9:
      case 0xd:
        break;
      case 2:
      case 3:
      case 0xb:
        cVar3 = ~(uint)bVar1 >> 2 & cmpGreaterThan;
        break;
      case 8:
      case 0xc:
      case 0xe:
        cVar3 = bVar2 >> 2 & cmpGreaterThan;
        break;
      case 10:
        bVar4 = (bool)(bVar1 >> 3 & 1);
        if (bVar4 == ((bVar2 >> 3 & 1) != 0)) {
          cVar3 = detail::IEEEFloat::compareAbsoluteValue(&this_00->IEEE,&rhs->IEEE);
          if ((*(byte *)((long)&this->U + 0x12) & 8) != 0) {
            if (cVar3 == cmpLessThan) {
              cVar3 = cmpGreaterThan;
            }
            else if (cVar3 == cmpGreaterThan) {
              cVar3 = cmpLessThan;
            }
          }
        }
        else {
          cVar3 = (uint)(byte)(bVar4 * '\x02' ^ 2);
        }
        break;
      case 0xf:
        cVar3 = cmpEqual;
        break;
      default:
        llvm_unreachable_internal
                  ((char *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                   ,0x744);
      }
      return cVar3;
    }
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x740,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compare(const IEEEFloat &) const");
  }
  cVar3 = detail::DoubleAPFloat::compare
                    ((DoubleAPFloat *)&this_00->IEEE,(DoubleAPFloat *)&rhs->IEEE);
  return cVar3;
}

Assistant:

const fltSemantics &getSemantics() const { return *U.semantics; }